

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_rel_prop
                   (string *__return_storage_ptr__,Property *prop,string *name,uint32_t indent)

{
  ostream *poVar1;
  uint32_t n;
  ListEditQual extraout_EDX;
  ListEditQual extraout_EDX_00;
  ListEditQual v;
  stringstream ss;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((prop->_type & ~Attrib) == Relation) {
    pprint::Indent_abi_cxx11_(&sStack_1d8,(pprint *)(ulong)indent,n);
    ::std::operator<<(local_1a8,(string *)&sStack_1d8);
    ::std::__cxx11::string::_M_dispose();
    v = extraout_EDX;
    if (prop->_has_custom == true) {
      ::std::operator<<(local_1a8,"custom ");
      v = extraout_EDX_00;
    }
    if (prop->_listOpQual != ResetToExplicit) {
      to_string_abi_cxx11_(&sStack_1d8,(tinyusdz *)(ulong)prop->_listOpQual,v);
      poVar1 = ::std::operator<<(local_1a8,(string *)&sStack_1d8);
      ::std::operator<<(poVar1," ");
      ::std::__cxx11::string::_M_dispose();
    }
    if ((prop->_rel)._varying_authored == true) {
      ::std::operator<<(local_1a8,"varying ");
    }
    anon_unknown_173::print_rel_only(&sStack_1d8,&prop->_rel,name,indent);
    ::std::operator<<(local_1a8,(string *)&sStack_1d8);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_rel_prop(const Property &prop, const std::string &name,
                           uint32_t indent) {
  std::stringstream ss;

  if (!prop.is_relationship()) {
    return ss.str();
  }

  ss << pprint::Indent(indent);

  if (prop.has_custom()) {
    ss << "custom ";
  }

  // List editing
  if (prop.get_listedit_qual() != ListEditQual::ResetToExplicit) {
    ss << to_string(prop.get_listedit_qual()) << " ";
  }

  const Relationship &rel = prop.get_relationship();
  if (rel.is_varying_authored()) {
    ss << "varying ";
  }

  ss << print_rel_only(rel, name, indent);

  return ss.str();
}